

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubGridIntersector1Pluecker<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  float *pfVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  RTCIntersectArguments *pRVar14;
  RTCRayQueryContext *pRVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  undefined1 (*pauVar34) [16];
  undefined4 uVar35;
  long lVar36;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar37;
  uint uVar38;
  int iVar39;
  uint uVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  byte bVar64;
  char cVar65;
  byte bVar93;
  byte bVar95;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  byte bVar102;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  char cVar94;
  char cVar96;
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar103;
  float fVar119;
  float fVar120;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar121;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar131;
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar133;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar147;
  float fVar149;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  float fVar150;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  float fVar158;
  float fVar159;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar161;
  float fVar168;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  float fVar173;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar186 [16];
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar191 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar205;
  undefined1 auVar204 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a1;
  undefined1 (*local_13a0) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1394;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  ulong local_1370;
  undefined8 local_1368;
  float fStack_1360;
  float fStack_135c;
  undefined1 local_1358 [8];
  uint uStack_1350;
  uint uStack_134c;
  RTCFilterFunctionNArguments local_1348;
  undefined1 local_1318 [16];
  undefined8 local_1308;
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  float local_12e8;
  float local_12e4;
  undefined4 local_12e0;
  undefined4 local_12dc;
  float local_12d8;
  undefined4 local_12d4;
  uint local_12d0;
  uint local_12cc;
  uint local_12c8;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined1 local_1288 [16];
  undefined1 *local_1278;
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  float local_1238 [4];
  float local_1228 [4];
  float local_1218 [4];
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [8];
  float fStack_11b0;
  float fStack_11ac;
  undefined1 local_11a8 [8];
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined8 local_1178;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  undefined4 uStack_1138;
  float fStack_1134;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  long local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  long local_10c8;
  ulong local_10c0;
  ulong local_10b8;
  long local_10b0;
  Scene *local_10a8;
  ulong local_10a0;
  undefined1 local_1098 [8];
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [8];
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  RTCRayQueryContext *pRVar40;
  undefined1 auVar74 [16];
  undefined1 auVar66 [11];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar67 [12];
  undefined1 auVar68 [13];
  undefined1 auVar80 [16];
  undefined1 auVar77 [16];
  undefined1 auVar76 [16];
  undefined2 uVar101;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_13a0 = (undefined1 (*) [16])local_f68;
      fVar147 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar190 = 0.0;
      if (0.0 <= fVar147) {
        fVar190 = fVar147;
      }
      aVar8 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar147 = (ray->super_RayK<1>).tfar;
      fVar196 = 0.0;
      if (0.0 <= fVar147) {
        fVar196 = fVar147;
      }
      uVar50 = -(uint)(1e-18 <= ABS(aVar8.x));
      uVar53 = -(uint)(1e-18 <= ABS(aVar8.y));
      uVar57 = -(uint)(1e-18 <= ABS(aVar8.z));
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1028 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar104 = divps(_DAT_01feca10,(undefined1  [16])aVar8);
      local_1068 = (float)(~uVar50 & 0x5d5e0b6b | auVar104._0_4_ & uVar50);
      fVar147 = (float)(~uVar53 & 0x5d5e0b6b | auVar104._4_4_ & uVar53);
      fVar160 = (float)(~uVar57 & 0x5d5e0b6b | auVar104._8_4_ & uVar57);
      fVar161 = local_1068 * 0.99999964;
      fVar168 = fVar147 * 0.99999964;
      fStack_1090 = fVar160 * 0.99999964;
      local_1068 = local_1068 * 1.0000004;
      fVar147 = fVar147 * 1.0000004;
      fStack_1010 = fVar160 * 1.0000004;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      local_1058._4_4_ = fVar168;
      local_1058._0_4_ = fVar168;
      fStack_1050 = fVar168;
      fStack_104c = fVar168;
      local_1098._4_4_ = fStack_1090;
      local_1098._0_4_ = fStack_1090;
      fStack_108c = fStack_1090;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      local_1078._4_4_ = fVar147;
      local_1078._0_4_ = fVar147;
      fStack_1070 = fVar147;
      fStack_106c = fVar147;
      local_1018._4_4_ = fStack_1010;
      local_1018._0_4_ = fStack_1010;
      fStack_100c = fStack_1010;
      local_10d0 = (ulong)(fVar161 < 0.0) << 4;
      local_10d8 = (ulong)(fVar168 < 0.0) << 4 | 0x20;
      local_10e0 = (ulong)(fStack_1090 < 0.0) << 4 | 0x40;
      local_10e8 = local_10d0 ^ 0x10;
      local_1088._4_4_ = fVar190;
      local_1088._0_4_ = fVar190;
      local_1088._8_4_ = fVar190;
      local_1088._12_4_ = fVar190;
      local_11e8._4_4_ = fVar196;
      local_11e8._0_4_ = fVar196;
      fStack_11e0 = fVar196;
      fStack_11dc = fVar196;
      local_1108 = (ulong)(((uint)(fVar161 < 0.0) << 4) >> 2);
      local_1110 = local_10e8 >> 2;
      local_1118 = local_10d8 >> 2;
      local_10f0 = local_10d8 ^ 0x10;
      local_1120 = (local_10d8 ^ 0x10) >> 2;
      local_1128 = local_10e0 >> 2;
      local_10f8 = local_10e0 ^ 0x10;
      local_1130 = (local_10e0 ^ 0x10) >> 2;
      _local_1008 = mm_lookupmask_ps._240_8_;
      _uStack_1000 = mm_lookupmask_ps._248_8_;
      local_1394._4_8_ = context;
      local_fe8 = fVar161;
      fStack_fe4 = fVar161;
      fStack_fe0 = fVar161;
      fStack_fdc = fVar161;
      auVar104 = _local_1098;
      auVar127 = local_1088;
      fVar147 = fVar161;
      fVar190 = fVar161;
      fVar196 = fVar161;
      do {
        do {
          do {
            if (local_13a0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar34 = local_13a0 + -1;
            local_13a0 = local_13a0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar34 + 8));
          uVar46 = *(ulong *)*local_13a0;
          do {
            if ((uVar46 & 8) == 0) {
              pfVar6 = (float *)(uVar46 + 0x20 + local_10d0);
              auVar69._0_4_ = (*pfVar6 - local_1038) * fVar161;
              auVar69._4_4_ = (pfVar6[1] - fStack_1034) * fVar147;
              auVar69._8_4_ = (pfVar6[2] - fStack_1030) * fVar190;
              auVar69._12_4_ = (pfVar6[3] - fStack_102c) * fVar196;
              pfVar6 = (float *)(uVar46 + 0x20 + local_10d8);
              auVar123._0_4_ = (*pfVar6 - local_1048) * (float)local_1058._0_4_;
              auVar123._4_4_ = (pfVar6[1] - fStack_1044) * (float)local_1058._4_4_;
              auVar123._8_4_ = (pfVar6[2] - fStack_1040) * fStack_1050;
              auVar123._12_4_ = (pfVar6[3] - fStack_103c) * fStack_104c;
              auVar69 = maxps(auVar69,auVar123);
              pfVar6 = (float *)(uVar46 + 0x20 + local_10e0);
              auVar153._0_4_ = (*pfVar6 - local_1028) * auVar104._0_4_;
              auVar153._4_4_ = (pfVar6[1] - fStack_1024) * auVar104._4_4_;
              auVar153._8_4_ = (pfVar6[2] - fStack_1020) * auVar104._8_4_;
              auVar153._12_4_ = (pfVar6[3] - fStack_101c) * auVar104._12_4_;
              pfVar6 = (float *)(uVar46 + 0x20 + local_10e8);
              auVar163._0_4_ = (*pfVar6 - local_1038) * local_1068;
              auVar163._4_4_ = (pfVar6[1] - fStack_1034) * fStack_1064;
              auVar163._8_4_ = (pfVar6[2] - fStack_1030) * fStack_1060;
              auVar163._12_4_ = (pfVar6[3] - fStack_102c) * fStack_105c;
              pfVar6 = (float *)(uVar46 + 0x20 + local_10f0);
              auVar135._0_4_ = (*pfVar6 - local_1048) * (float)local_1078._0_4_;
              auVar135._4_4_ = (pfVar6[1] - fStack_1044) * (float)local_1078._4_4_;
              auVar135._8_4_ = (pfVar6[2] - fStack_1040) * fStack_1070;
              auVar135._12_4_ = (pfVar6[3] - fStack_103c) * fStack_106c;
              auVar123 = minps(auVar163,auVar135);
              pfVar6 = (float *)(uVar46 + 0x20 + local_10f8);
              auVar136._0_4_ = (*pfVar6 - local_1028) * (float)local_1018._0_4_;
              auVar136._4_4_ = (pfVar6[1] - fStack_1024) * (float)local_1018._4_4_;
              auVar136._8_4_ = (pfVar6[2] - fStack_1020) * fStack_1010;
              auVar136._12_4_ = (pfVar6[3] - fStack_101c) * fStack_100c;
              auVar105 = maxps(auVar153,auVar127);
              _local_12a8 = maxps(auVar69,auVar105);
              auVar69 = minps(auVar136,_local_11e8);
              auVar69 = minps(auVar123,auVar69);
              auVar105._4_4_ = -(uint)(local_12a8._4_4_ <= auVar69._4_4_);
              auVar105._0_4_ = -(uint)(local_12a8._0_4_ <= auVar69._0_4_);
              auVar105._8_4_ = -(uint)(local_12a8._8_4_ <= auVar69._8_4_);
              auVar105._12_4_ = -(uint)(local_12a8._12_4_ <= auVar69._12_4_);
              uVar35 = movmskps((int)local_10f8,auVar105);
              local_10c0 = CONCAT44((int)(local_10f8 >> 0x20),uVar35);
            }
            if ((uVar46 & 8) == 0) {
              if (local_10c0 == 0) {
                iVar42 = 4;
              }
              else {
                uVar45 = uVar46 & 0xfffffffffffffff0;
                lVar36 = 0;
                if (local_10c0 != 0) {
                  for (; (local_10c0 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                iVar42 = 0;
                uVar46 = *(ulong *)(uVar45 + lVar36 * 8);
                uVar43 = local_10c0 - 1 & local_10c0;
                if (uVar43 != 0) {
                  uVar50 = *(uint *)(local_12a8 + lVar36 * 4);
                  lVar36 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                    }
                  }
                  uVar44 = *(ulong *)(uVar45 + lVar36 * 8);
                  uVar53 = *(uint *)(local_12a8 + lVar36 * 4);
                  uVar43 = uVar43 - 1 & uVar43;
                  if (uVar43 == 0) {
                    if (uVar50 < uVar53) {
                      *(ulong *)*local_13a0 = uVar44;
                      *(uint *)((long)*local_13a0 + 8) = uVar53;
                      local_13a0 = local_13a0 + 1;
                    }
                    else {
                      *(ulong *)*local_13a0 = uVar46;
                      *(uint *)((long)*local_13a0 + 8) = uVar50;
                      uVar46 = uVar44;
                      local_13a0 = local_13a0 + 1;
                    }
                  }
                  else {
                    auVar70._8_4_ = uVar50;
                    auVar70._0_8_ = uVar46;
                    auVar70._12_4_ = 0;
                    auVar106._8_4_ = uVar53;
                    auVar106._0_8_ = uVar44;
                    auVar106._12_4_ = 0;
                    lVar36 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    uVar46 = *(ulong *)(uVar45 + lVar36 * 8);
                    iVar39 = *(int *)(local_12a8 + lVar36 * 4);
                    auVar124._8_4_ = iVar39;
                    auVar124._0_8_ = uVar46;
                    auVar124._12_4_ = 0;
                    auVar137._8_4_ = -(uint)((int)uVar50 < (int)uVar53);
                    uVar43 = uVar43 - 1 & uVar43;
                    if (uVar43 == 0) {
                      auVar137._4_4_ = auVar137._8_4_;
                      auVar137._0_4_ = auVar137._8_4_;
                      auVar137._12_4_ = auVar137._8_4_;
                      auVar69 = auVar70 & auVar137 | ~auVar137 & auVar106;
                      auVar105 = auVar106 & auVar137 | ~auVar137 & auVar70;
                      auVar138._8_4_ = -(uint)(auVar69._8_4_ < iVar39);
                      auVar138._0_8_ = CONCAT44(auVar138._8_4_,auVar138._8_4_);
                      auVar138._12_4_ = auVar138._8_4_;
                      uVar46 = ~auVar138._0_8_ & uVar46 | auVar69._0_8_ & auVar138._0_8_;
                      auVar69 = auVar124 & auVar138 | ~auVar138 & auVar69;
                      auVar71._8_4_ = -(uint)(auVar105._8_4_ < auVar69._8_4_);
                      auVar71._4_4_ = auVar71._8_4_;
                      auVar71._0_4_ = auVar71._8_4_;
                      auVar71._12_4_ = auVar71._8_4_;
                      *local_13a0 = ~auVar71 & auVar105 | auVar69 & auVar71;
                      local_13a0[1] = auVar105 & auVar71 | ~auVar71 & auVar69;
                      local_13a0 = local_13a0 + 2;
                    }
                    else {
                      lVar36 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                        }
                      }
                      iVar11 = *(int *)(local_12a8 + lVar36 * 4);
                      auVar152._8_4_ = iVar11;
                      auVar152._0_8_ = *(undefined8 *)(uVar45 + lVar36 * 8);
                      auVar152._12_4_ = 0;
                      auVar139._4_4_ = auVar137._8_4_;
                      auVar139._0_4_ = auVar137._8_4_;
                      auVar139._8_4_ = auVar137._8_4_;
                      auVar139._12_4_ = auVar137._8_4_;
                      auVar69 = auVar70 & auVar139 | ~auVar139 & auVar106;
                      auVar105 = auVar106 & auVar139 | ~auVar139 & auVar70;
                      auVar162._0_4_ = -(uint)(iVar39 < iVar11);
                      auVar162._4_4_ = -(uint)(iVar39 < iVar11);
                      auVar162._8_4_ = -(uint)(iVar39 < iVar11);
                      auVar162._12_4_ = -(uint)(iVar39 < iVar11);
                      auVar123 = auVar124 & auVar162 | ~auVar162 & auVar152;
                      auVar163 = ~auVar162 & auVar124 | auVar152 & auVar162;
                      auVar125._8_4_ = -(uint)(auVar105._8_4_ < auVar163._8_4_);
                      auVar125._4_4_ = auVar125._8_4_;
                      auVar125._0_4_ = auVar125._8_4_;
                      auVar125._12_4_ = auVar125._8_4_;
                      auVar153 = auVar105 & auVar125 | ~auVar125 & auVar163;
                      auVar107._8_4_ = -(uint)(auVar69._8_4_ < auVar123._8_4_);
                      auVar107._0_8_ = CONCAT44(auVar107._8_4_,auVar107._8_4_);
                      auVar107._12_4_ = auVar107._8_4_;
                      uVar46 = auVar69._0_8_ & auVar107._0_8_ | ~auVar107._0_8_ & auVar123._0_8_;
                      auVar69 = ~auVar107 & auVar69 | auVar123 & auVar107;
                      auVar72._8_4_ = -(uint)(auVar69._8_4_ < auVar153._8_4_);
                      auVar72._4_4_ = auVar72._8_4_;
                      auVar72._0_4_ = auVar72._8_4_;
                      auVar72._12_4_ = auVar72._8_4_;
                      *local_13a0 = ~auVar125 & auVar105 | auVar163 & auVar125;
                      local_13a0[1] = ~auVar72 & auVar69 | auVar153 & auVar72;
                      local_13a0[2] = auVar69 & auVar72 | ~auVar72 & auVar153;
                      local_13a0 = local_13a0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar42 = 6;
            }
          } while (iVar42 == 0);
        } while (iVar42 != 6);
        local_1100 = (ulong)((uint)uVar46 & 0xf) - 8;
        if (local_1100 != 0) {
          uVar46 = uVar46 & 0xfffffffffffffff0;
          local_10c8 = 0;
          local_10b8 = uVar46;
          do {
            lVar36 = local_10c8 * 0x58;
            local_10b0 = uVar46 + lVar36;
            uVar7 = *(undefined8 *)(uVar46 + 0x20 + lVar36);
            uVar35 = *(undefined4 *)(uVar46 + 0x24 + lVar36);
            bVar102 = (byte)uVar7;
            bVar64 = (byte)uVar35;
            bVar16 = (byte)((ulong)uVar7 >> 8);
            bVar93 = (byte)((uint)uVar35 >> 8);
            bVar17 = (byte)((ulong)uVar7 >> 0x10);
            bVar95 = (byte)((uint)uVar35 >> 0x10);
            bVar21 = (byte)((uint)uVar35 >> 0x18);
            bVar18 = (byte)((ulong)uVar7 >> 0x18);
            cVar65 = -((byte)((bVar102 < bVar64) * bVar102 | (bVar102 >= bVar64) * bVar64) ==
                      bVar102);
            cVar94 = -((byte)((bVar16 < bVar93) * bVar16 | (bVar16 >= bVar93) * bVar93) == bVar16);
            cVar96 = -((byte)((bVar17 < bVar95) * bVar17 | (bVar17 >= bVar95) * bVar95) == bVar17);
            cVar97 = -((byte)((bVar18 < bVar21) * bVar18 | (bVar18 >= bVar21) * bVar21) == bVar18);
            cVar98 = -((char)((ulong)uVar7 >> 0x20) == '\0');
            cVar99 = -((char)((ulong)uVar7 >> 0x28) == '\0');
            cVar100 = -((char)((ulong)uVar7 >> 0x30) == '\0');
            bVar102 = -((char)((ulong)uVar7 >> 0x38) == '\0');
            auVar74._0_9_ = CONCAT18(0xff,(ulong)bVar102 << 0x38);
            auVar66._0_10_ = CONCAT19(0xff,auVar74._0_9_);
            auVar66[10] = 0xff;
            auVar67[0xb] = 0xff;
            auVar67._0_11_ = auVar66;
            auVar68[0xc] = 0xff;
            auVar68._0_12_ = auVar67;
            auVar77[0xd] = 0xff;
            auVar77._0_13_ = auVar68;
            fVar160 = *(float *)(uVar46 + 0x38 + lVar36);
            fVar168 = *(float *)(uVar46 + 0x3c + lVar36);
            fVar189 = *(float *)(uVar46 + 0x44 + lVar36);
            uVar50 = *(uint *)(local_1108 + 0x20 + local_10b0);
            auVar27[0xc] = (char)(uVar50 >> 0x18);
            auVar27._0_12_ = ZEXT712(0);
            uVar53 = *(uint *)(local_1110 + 0x20 + local_10b0);
            auVar22[0xc] = (char)(uVar53 >> 0x18);
            auVar22._0_12_ = ZEXT712(0);
            fVar173 = *(float *)(uVar46 + 0x48 + lVar36);
            uVar57 = *(uint *)(local_1118 + 0x20 + local_10b0);
            auVar23[0xc] = (char)(uVar57 >> 0x18);
            auVar23._0_12_ = ZEXT712(0);
            uVar38 = *(uint *)(local_1120 + 0x20 + local_10b0);
            auVar24[0xc] = (char)(uVar38 >> 0x18);
            auVar24._0_12_ = ZEXT712(0);
            fVar103 = *(float *)(uVar46 + 0x4c + lVar36);
            uVar41 = *(uint *)(local_1128 + 0x20 + local_10b0);
            auVar25[0xc] = (char)(uVar41 >> 0x18);
            auVar25._0_12_ = ZEXT712(0);
            uVar51 = *(uint *)(local_1130 + 0x20 + local_10b0);
            auVar26[0xc] = (char)(uVar51 >> 0x18);
            auVar26._0_12_ = ZEXT712(0);
            fVar119 = *(float *)(uVar46 + 0x40 + lVar36);
            auVar108._0_4_ = (((float)(uVar50 & 0xff) * fVar189 + fVar160) - local_1038) * fVar161;
            auVar108._4_4_ =
                 (((float)(uVar50 >> 8 & 0xff) * fVar189 + fVar160) - fStack_1034) * fVar147;
            auVar108._8_4_ =
                 (((float)(int)CONCAT32(auVar27._10_3_,(ushort)(byte)(uVar50 >> 0x10)) * fVar189 +
                  fVar160) - fStack_1030) * fVar190;
            auVar108._12_4_ =
                 (((float)(uint3)(auVar27._10_3_ >> 0x10) * fVar189 + fVar160) - fStack_102c) *
                 fVar196;
            auVar154._0_4_ =
                 (((float)(uVar57 & 0xff) * fVar173 + fVar168) - local_1048) *
                 (float)local_1058._0_4_;
            auVar154._4_4_ =
                 (((float)(uVar57 >> 8 & 0xff) * fVar173 + fVar168) - fStack_1044) *
                 (float)local_1058._4_4_;
            auVar154._8_4_ =
                 (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar57 >> 0x10)) * fVar173 +
                  fVar168) - fStack_1040) * fStack_1050;
            auVar154._12_4_ =
                 (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar173 + fVar168) - fStack_103c) *
                 fStack_104c;
            auVar104 = maxps(auVar108,auVar154);
            auVar126._0_4_ =
                 (((float)(uVar53 & 0xff) * fVar189 + fVar160) - local_1038) * local_1068;
            auVar126._4_4_ =
                 (((float)(uVar53 >> 8 & 0xff) * fVar189 + fVar160) - fStack_1034) * fStack_1064;
            auVar126._8_4_ =
                 (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar53 >> 0x10)) * fVar189 +
                  fVar160) - fStack_1030) * fStack_1060;
            auVar126._12_4_ =
                 (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar189 + fVar160) - fStack_102c) *
                 fStack_105c;
            auVar140._0_4_ =
                 (((float)(uVar38 & 0xff) * fVar173 + fVar168) - local_1048) *
                 (float)local_1078._0_4_;
            auVar140._4_4_ =
                 (((float)(uVar38 >> 8 & 0xff) * fVar173 + fVar168) - fStack_1044) *
                 (float)local_1078._4_4_;
            auVar140._8_4_ =
                 (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar38 >> 0x10)) * fVar173 +
                  fVar168) - fStack_1040) * fStack_1070;
            auVar140._12_4_ =
                 (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar173 + fVar168) - fStack_103c) *
                 fStack_106c;
            auVar127 = minps(auVar126,auVar140);
            auVar164._0_4_ =
                 (((float)(uVar41 & 0xff) * fVar103 + fVar119) - local_1028) *
                 (float)local_1098._0_4_;
            auVar164._4_4_ =
                 (((float)(uVar41 >> 8 & 0xff) * fVar103 + fVar119) - fStack_1024) *
                 (float)local_1098._4_4_;
            auVar164._8_4_ =
                 (((float)(int)CONCAT32(auVar25._10_3_,(ushort)(byte)(uVar41 >> 0x10)) * fVar103 +
                  fVar119) - fStack_1020) * fStack_1090;
            auVar164._12_4_ =
                 (((float)(uint3)(auVar25._10_3_ >> 0x10) * fVar103 + fVar119) - fStack_101c) *
                 fStack_108c;
            auVar69 = maxps(auVar164,local_1088);
            local_f88 = maxps(auVar104,auVar69);
            auVar169._0_4_ =
                 (((float)(uVar51 & 0xff) * fVar103 + fVar119) - local_1028) *
                 (float)local_1018._0_4_;
            auVar169._4_4_ =
                 (((float)(uVar51 >> 8 & 0xff) * fVar103 + fVar119) - fStack_1024) *
                 (float)local_1018._4_4_;
            auVar169._8_4_ =
                 (((float)(int)CONCAT32(auVar26._10_3_,(ushort)(byte)(uVar51 >> 0x10)) * fVar103 +
                  fVar119) - fStack_1020) * fStack_1010;
            auVar169._12_4_ =
                 (((float)(uint3)(auVar26._10_3_ >> 0x10) * fVar103 + fVar119) - fStack_101c) *
                 fStack_100c;
            auVar104 = minps(auVar169,_local_11e8);
            auVar69 = minps(auVar127,auVar104);
            auVar77[0xe] = bVar102;
            auVar77[0xf] = bVar102;
            auVar76._14_2_ = auVar77._14_2_;
            auVar76[0xd] = cVar100;
            auVar76._0_13_ = auVar68;
            auVar104._13_3_ = auVar76._13_3_;
            auVar104[0xc] = cVar100;
            auVar104._0_12_ = auVar67;
            auVar127._12_4_ = auVar104._12_4_;
            auVar127[0xb] = cVar99;
            auVar127._0_11_ = auVar66;
            auVar75._11_5_ = auVar127._11_5_;
            auVar75[10] = cVar99;
            auVar75._0_10_ = auVar66._0_10_;
            auVar74._10_6_ = auVar75._10_6_;
            auVar74[9] = cVar98;
            Var32 = CONCAT91(CONCAT81((long)(CONCAT72(auVar74._9_7_,CONCAT11(cVar98,bVar102)) >> 8),
                                      cVar97),cVar97);
            auVar31._2_10_ = Var32;
            auVar31[1] = cVar96;
            auVar31[0] = cVar96;
            auVar30._2_12_ = auVar31;
            auVar30[1] = cVar94;
            auVar30[0] = cVar94;
            auVar73._0_2_ = CONCAT11(cVar65,cVar65);
            auVar73._2_14_ = auVar30;
            uVar101 = (undefined2)Var32;
            auVar80._0_12_ = auVar73._0_12_;
            auVar80._12_2_ = uVar101;
            auVar80._14_2_ = uVar101;
            auVar79._12_4_ = auVar80._12_4_;
            auVar79._0_10_ = auVar73._0_10_;
            auVar79._10_2_ = auVar31._0_2_;
            auVar78._10_6_ = auVar79._10_6_;
            auVar78._0_8_ = auVar73._0_8_;
            auVar78._8_2_ = auVar31._0_2_;
            auVar33._4_8_ = auVar78._8_8_;
            auVar33._2_2_ = auVar30._0_2_;
            auVar33._0_2_ = auVar30._0_2_;
            uVar50 = CONCAT22(auVar73._0_2_,auVar73._0_2_);
            auVar109._0_4_ = -(uint)(local_f88._0_4_ <= auVar69._0_4_) & uVar50;
            auVar109._4_4_ = -(uint)(local_f88._4_4_ <= auVar69._4_4_) & auVar33._0_4_;
            auVar109._8_4_ = -(uint)(local_f88._8_4_ <= auVar69._8_4_) & auVar78._8_4_;
            auVar109._12_4_ = -(uint)(local_f88._12_4_ <= auVar69._12_4_) & auVar79._12_4_;
            uVar50 = movmskps((int)lVar36,auVar109);
            if (uVar50 != 0) {
              local_10a0 = (ulong)(uVar50 & 0xff);
              do {
                auVar104 = _local_12b8;
                lVar36 = 0;
                if (local_10a0 != 0) {
                  for (; (local_10a0 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                fVar147 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_f88 + lVar36 * 4) <= fVar147) {
                  local_1318 = ZEXT416((uint)fVar147);
                  uVar9 = *(ushort *)(local_10b0 + lVar36 * 8);
                  uVar10 = *(ushort *)(local_10b0 + 2 + lVar36 * 8);
                  uVar50 = *(uint *)(local_10b0 + 0x50);
                  uVar53 = *(uint *)(local_10b0 + 4 + lVar36 * 8);
                  local_10a8 = context->scene;
                  pGVar12 = (local_10a8->geometries).items[uVar50].ptr;
                  uVar45 = *(ulong *)&pGVar12->field_0x58;
                  lVar36 = *(long *)&pGVar12[1].time_range.upper;
                  local_1370 = (ulong)uVar53;
                  lVar49 = (ulong)uVar53 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar38 = uVar9 & 0x7fff;
                  pRVar40 = (RTCRayQueryContext *)(ulong)uVar38;
                  uVar41 = uVar10 & 0x7fff;
                  uVar57 = *(uint *)(uVar45 + 4 + lVar49);
                  uVar44 = (ulong)uVar57;
                  uVar43 = (ulong)(uVar57 * uVar41 + *(int *)(uVar45 + lVar49) + uVar38);
                  p_Var13 = pGVar12[1].intersectionFilterN;
                  pfVar6 = (float *)(lVar36 + (long)p_Var13 * uVar43);
                  pfVar1 = (float *)(lVar36 + (uVar43 + 1) * (long)p_Var13);
                  fVar190 = *pfVar1;
                  local_1188 = pfVar1[1];
                  fVar196 = pfVar1[2];
                  pfVar1 = (float *)(lVar36 + (uVar44 + uVar43) * (long)p_Var13);
                  local_12b8._0_4_ = *pfVar1;
                  local_12f8._0_4_ = pfVar1[1];
                  fVar161 = pfVar1[2];
                  lVar47 = uVar44 + uVar43 + 1;
                  pfVar1 = (float *)(lVar36 + lVar47 * (long)p_Var13);
                  local_12b8._4_4_ = *pfVar1;
                  local_1158 = pfVar1[1];
                  fStack_1164 = pfVar1[2];
                  uVar46 = (ulong)(-1 < (short)uVar9);
                  pfVar1 = (float *)(lVar36 + (uVar46 + 1 + uVar43) * (long)p_Var13);
                  lVar48 = uVar46 + lVar47;
                  pfVar2 = (float *)(lVar36 + lVar48 * (long)p_Var13);
                  fStack_1154 = pfVar2[1];
                  uVar46 = 0;
                  if (-1 < (short)uVar10) {
                    uVar46 = uVar44;
                  }
                  pfVar3 = (float *)(lVar36 + (uVar44 + uVar43 + uVar46) * (long)p_Var13);
                  pfVar4 = (float *)(lVar36 + (lVar47 + uVar46) * (long)p_Var13);
                  fStack_1134 = *pfVar4;
                  fStack_114c = pfVar4[1];
                  puVar5 = (undefined4 *)(lVar36 + (uVar46 + lVar48) * (long)p_Var13);
                  local_1148 = CONCAT44(*pfVar2,local_12b8._4_4_);
                  uStack_1138 = *puVar5;
                  fStack_1150 = (float)puVar5[1];
                  fVar160 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar168 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar189 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_11b8._0_4_ = *pfVar6 - fVar160;
                  local_11b8._4_4_ = fVar190 - fVar160;
                  fStack_11b0 = (float)local_12b8._4_4_ - fVar160;
                  fStack_11ac = (float)local_12b8._0_4_ - fVar160;
                  local_1198 = CONCAT44(*pfVar1,fVar190);
                  fVar190 = fVar190 - fVar160;
                  fVar192 = *pfVar1 - fVar160;
                  fVar193 = *pfVar2 - fVar160;
                  fVar194 = (float)local_12b8._4_4_ - fVar160;
                  _fStack_12b0 = auVar104._8_8_;
                  local_12a8._4_4_ = *pfVar3;
                  local_12a8._0_4_ = fStack_1134;
                  fVar151 = (float)local_12b8._0_4_ - fVar160;
                  fVar158 = (float)local_12b8._4_4_ - fVar160;
                  fVar159 = fStack_1134 - fVar160;
                  fVar160 = *pfVar3 - fVar160;
                  local_11c8 = pfVar6[1] - fVar168;
                  fStack_11c4 = local_1188 - fVar168;
                  fStack_11c0 = local_1158 - fVar168;
                  fStack_11bc = (float)local_12f8._0_4_ - fVar168;
                  fStack_1184 = pfVar1[1];
                  fStack_1180 = fStack_1154;
                  fStack_117c = local_1158;
                  fVar195 = local_1188 - fVar168;
                  fVar197 = pfVar1[1] - fVar168;
                  fVar199 = fStack_1154 - fVar168;
                  fVar201 = local_1158 - fVar168;
                  local_12f8._4_4_ = local_1158;
                  fStack_12f0 = fStack_114c;
                  fStack_12ec = pfVar3[1];
                  fVar174 = (float)local_12f8._0_4_ - fVar168;
                  fVar175 = local_1158 - fVar168;
                  fVar176 = fStack_114c - fVar168;
                  fVar168 = pfVar3[1] - fVar168;
                  local_11a8._0_4_ = pfVar6[2] - fVar189;
                  local_11a8._4_4_ = fVar196 - fVar189;
                  fStack_11a0 = fStack_1164 - fVar189;
                  fStack_119c = fVar161 - fVar189;
                  local_1178 = CONCAT44(pfVar1[2],fVar196);
                  local_1168 = pfVar2[2];
                  fVar196 = fVar196 - fVar189;
                  fVar198 = pfVar1[2] - fVar189;
                  fVar200 = pfVar2[2] - fVar189;
                  fVar202 = fStack_1164 - fVar189;
                  local_1368 = CONCAT44(fStack_1164,fVar161);
                  local_1358._4_4_ = pfVar3[2];
                  local_1358._0_4_ = pfVar4[2];
                  fVar161 = fVar161 - fVar189;
                  fVar187 = fStack_1164 - fVar189;
                  fVar188 = pfVar4[2] - fVar189;
                  fVar189 = pfVar3[2] - fVar189;
                  local_fa8 = fVar174 - local_11c8;
                  fStack_fa4 = fVar175 - fStack_11c4;
                  fStack_fa0 = fVar176 - fStack_11c0;
                  fStack_f9c = fVar168 - fStack_11bc;
                  local_f98 = fVar161 - (float)local_11a8._0_4_;
                  fStack_f94 = fVar187 - (float)local_11a8._4_4_;
                  fStack_f90 = fVar188 - fStack_11a0;
                  fStack_f8c = fVar189 - fStack_119c;
                  fVar177 = fVar151 - (float)local_11b8._0_4_;
                  fVar180 = fVar158 - (float)local_11b8._4_4_;
                  fVar182 = fVar159 - fStack_11b0;
                  fVar184 = fVar160 - fStack_11ac;
                  local_11d8 = fVar177;
                  fStack_11d4 = fVar180;
                  fStack_11d0 = fVar182;
                  fStack_11cc = fVar184;
                  fVar173 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fStack_1300 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_1394.m128[3] = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1308 = (RTCRayQueryContext *)CONCAT44(fStack_1300,fStack_1300);
                  fStack_12fc = fStack_1300;
                  fVar203 = (local_fa8 * (fVar161 + (float)local_11a8._0_4_) -
                            local_f98 * (fVar174 + local_11c8)) * fVar173 +
                            (local_f98 * (fVar151 + (float)local_11b8._0_4_) -
                            (fVar161 + (float)local_11a8._0_4_) * fVar177) * fStack_1300 +
                            ((fVar174 + local_11c8) * fVar177 -
                            (fVar151 + (float)local_11b8._0_4_) * local_fa8) * local_1394.m128[3];
                  fVar205 = (fStack_fa4 * (fVar187 + (float)local_11a8._4_4_) -
                            fStack_f94 * (fVar175 + fStack_11c4)) * fVar173 +
                            (fStack_f94 * (fVar158 + (float)local_11b8._4_4_) -
                            (fVar187 + (float)local_11a8._4_4_) * fVar180) * fStack_1300 +
                            ((fVar175 + fStack_11c4) * fVar180 -
                            (fVar158 + (float)local_11b8._4_4_) * fStack_fa4) * local_1394.m128[3];
                  local_fb8._0_8_ = CONCAT44(fVar205,fVar203);
                  local_fb8._8_4_ =
                       (fStack_fa0 * (fVar188 + fStack_11a0) - fStack_f90 * (fVar176 + fStack_11c0))
                       * fVar173 +
                       (fStack_f90 * (fVar159 + fStack_11b0) - (fVar188 + fStack_11a0) * fVar182) *
                       fStack_1300 +
                       ((fVar176 + fStack_11c0) * fVar182 - (fVar159 + fStack_11b0) * fStack_fa0) *
                       local_1394.m128[3];
                  local_fb8._12_4_ =
                       (fStack_f9c * (fVar189 + fStack_119c) - fStack_f8c * (fVar168 + fStack_11bc))
                       * fVar173 +
                       (fStack_f8c * (fVar160 + fStack_11ac) - (fVar189 + fStack_119c) * fVar184) *
                       fStack_1300 +
                       ((fVar168 + fStack_11bc) * fVar184 - (fVar160 + fStack_11ac) * fStack_f9c) *
                       local_1394.m128[3];
                  fVar134 = local_11c8 - fVar195;
                  fVar148 = fStack_11c4 - fVar197;
                  fVar149 = fStack_11c0 - fVar199;
                  fVar150 = fStack_11bc - fVar201;
                  fVar178 = (float)local_11a8._0_4_ - fVar196;
                  fVar181 = (float)local_11a8._4_4_ - fVar198;
                  fVar183 = fStack_11a0 - fVar200;
                  fVar185 = fStack_119c - fVar202;
                  fVar122 = (float)local_11b8._0_4_ - fVar190;
                  fVar131 = (float)local_11b8._4_4_ - fVar192;
                  fVar132 = fStack_11b0 - fVar193;
                  fVar133 = fStack_11ac - fVar194;
                  fVar206 = (fVar134 * ((float)local_11a8._0_4_ + fVar196) -
                            fVar178 * (local_11c8 + fVar195)) * fVar173 +
                            (fVar178 * ((float)local_11b8._0_4_ + fVar190) -
                            ((float)local_11a8._0_4_ + fVar196) * fVar122) * fStack_1300 +
                            ((local_11c8 + fVar195) * fVar122 -
                            ((float)local_11b8._0_4_ + fVar190) * fVar134) * local_1394.m128[3];
                  fVar207 = (fVar148 * ((float)local_11a8._4_4_ + fVar198) -
                            fVar181 * (fStack_11c4 + fVar197)) * fVar173 +
                            (fVar181 * ((float)local_11b8._4_4_ + fVar192) -
                            ((float)local_11a8._4_4_ + fVar198) * fVar131) * fStack_1300 +
                            ((fStack_11c4 + fVar197) * fVar131 -
                            ((float)local_11b8._4_4_ + fVar192) * fVar148) * local_1394.m128[3];
                  fVar208 = (fVar149 * (fStack_11a0 + fVar200) - fVar183 * (fStack_11c0 + fVar199))
                            * fVar173 +
                            (fVar183 * (fStack_11b0 + fVar193) - (fStack_11a0 + fVar200) * fVar132)
                            * fStack_1300 +
                            ((fStack_11c0 + fVar199) * fVar132 - (fStack_11b0 + fVar193) * fVar149)
                            * local_1394.m128[3];
                  fVar209 = (fVar150 * (fStack_119c + fVar202) - fVar185 * (fStack_11bc + fVar201))
                            * fVar173 +
                            (fVar185 * (fStack_11ac + fVar194) - (fStack_119c + fVar202) * fVar133)
                            * fStack_1300 +
                            ((fStack_11bc + fVar201) * fVar133 - (fStack_11ac + fVar194) * fVar150)
                            * local_1394.m128[3];
                  auVar165._0_4_ = fVar190 - fVar151;
                  auVar165._4_4_ = fVar192 - fVar158;
                  auVar165._8_4_ = fVar193 - fVar159;
                  auVar165._12_4_ = fVar194 - fVar160;
                  fVar103 = fVar195 - fVar174;
                  fVar119 = fVar197 - fVar175;
                  fVar120 = fVar199 - fVar176;
                  fVar121 = fVar201 - fVar168;
                  fVar210 = fVar196 - fVar161;
                  fVar211 = fVar198 - fVar187;
                  fVar212 = fVar200 - fVar188;
                  fVar213 = fVar202 - fVar189;
                  fStack_1384 = local_1394.m128[3];
                  fStack_1380 = local_1394.m128[3];
                  fStack_137c = local_1394.m128[3];
                  auVar81._0_4_ =
                       (fVar103 * (fVar161 + fVar196) - fVar210 * (fVar174 + fVar195)) * fVar173 +
                       (fVar210 * (fVar151 + fVar190) - (fVar161 + fVar196) * auVar165._0_4_) *
                       fStack_1300 +
                       ((fVar174 + fVar195) * auVar165._0_4_ - (fVar151 + fVar190) * fVar103) *
                       local_1394.m128[3];
                  auVar81._4_4_ =
                       (fVar119 * (fVar187 + fVar198) - fVar211 * (fVar175 + fVar197)) * fVar173 +
                       (fVar211 * (fVar158 + fVar192) - (fVar187 + fVar198) * auVar165._4_4_) *
                       fStack_1300 +
                       ((fVar175 + fVar197) * auVar165._4_4_ - (fVar158 + fVar192) * fVar119) *
                       local_1394.m128[3];
                  auVar81._8_4_ =
                       (fVar120 * (fVar188 + fVar200) - fVar212 * (fVar176 + fVar199)) * fVar173 +
                       (fVar212 * (fVar159 + fVar193) - (fVar188 + fVar200) * auVar165._8_4_) *
                       fStack_1300 +
                       ((fVar176 + fVar199) * auVar165._8_4_ - (fVar159 + fVar193) * fVar120) *
                       local_1394.m128[3];
                  auVar81._12_4_ =
                       (fVar121 * (fVar189 + fVar202) - fVar213 * (fVar168 + fVar201)) * fVar173 +
                       (fVar213 * (fVar160 + fVar194) - (fVar189 + fVar202) * auVar165._12_4_) *
                       fStack_1300 +
                       ((fVar168 + fVar201) * auVar165._12_4_ - (fVar160 + fVar194) * fVar121) *
                       local_1394.m128[3];
                  fVar190 = fVar203 + fVar206 + auVar81._0_4_;
                  fVar196 = fVar205 + fVar207 + auVar81._4_4_;
                  fVar161 = local_fb8._8_4_ + fVar208 + auVar81._8_4_;
                  fVar160 = local_fb8._12_4_ + fVar209 + auVar81._12_4_;
                  auVar186._8_4_ = local_fb8._8_4_;
                  auVar186._0_8_ = local_fb8._0_8_;
                  auVar186._12_4_ = local_fb8._12_4_;
                  auVar19._4_4_ = fVar207;
                  auVar19._0_4_ = fVar206;
                  auVar19._8_4_ = fVar208;
                  auVar19._12_4_ = fVar209;
                  auVar104 = minps(auVar186,auVar19);
                  auVar127 = minps(auVar104,auVar81);
                  auVar155._8_4_ = local_fb8._8_4_;
                  auVar155._0_8_ = local_fb8._0_8_;
                  auVar155._12_4_ = local_fb8._12_4_;
                  auVar20._4_4_ = fVar207;
                  auVar20._0_4_ = fVar206;
                  auVar20._8_4_ = fVar208;
                  auVar20._12_4_ = fVar209;
                  auVar104 = maxps(auVar155,auVar20);
                  auVar104 = maxps(auVar104,auVar81);
                  local_fd8 = ABS(fVar190);
                  fStack_fd4 = ABS(fVar196);
                  fStack_fd0 = ABS(fVar161);
                  fStack_fcc = ABS(fVar160);
                  local_1278 = &local_13a1;
                  auVar156._0_4_ =
                       -(uint)(auVar104._0_4_ <= local_fd8 * 1.1920929e-07 ||
                              -(local_fd8 * 1.1920929e-07) <= auVar127._0_4_) & local_1008;
                  auVar156._4_4_ =
                       -(uint)(auVar104._4_4_ <= fStack_fd4 * 1.1920929e-07 ||
                              -(fStack_fd4 * 1.1920929e-07) <= auVar127._4_4_) & uStack_1004;
                  auVar156._8_4_ =
                       -(uint)(auVar104._8_4_ <= fStack_fd0 * 1.1920929e-07 ||
                              -(fStack_fd0 * 1.1920929e-07) <= auVar127._8_4_) & uStack_1000;
                  auVar156._12_4_ =
                       -(uint)(auVar104._12_4_ <= fStack_fcc * 1.1920929e-07 ||
                              -(fStack_fcc * 1.1920929e-07) <= auVar127._12_4_) & uStack_ffc;
                  iVar42 = movmskps((int)lVar36,auVar156);
                  local_11f8 = ZEXT416(uVar38);
                  local_ff8 = ZEXT416(uVar41);
                  uVar46 = uVar45;
                  context = (RayQueryContext *)local_1394._4_8_;
                  if (iVar42 != 0) {
                    local_fc8 = fVar206;
                    fStack_fc4 = fVar207;
                    fStack_fc0 = fVar208;
                    fStack_fbc = fVar209;
                    local_11d8 = fVar190;
                    fStack_11d4 = fVar196;
                    fStack_11d0 = fVar161;
                    fStack_11cc = fVar160;
                    uVar57 = -(uint)(ABS(fVar178 * fVar103) <= ABS(local_f98 * fVar134));
                    uVar54 = -(uint)(ABS(fVar181 * fVar119) <= ABS(fStack_f94 * fVar148));
                    uVar58 = -(uint)(ABS(fVar183 * fVar120) <= ABS(fStack_f90 * fVar149));
                    uVar61 = -(uint)(ABS(fVar185 * fVar121) <= ABS(fStack_f8c * fVar150));
                    uVar51 = -(uint)(ABS(fVar122 * fVar210) <= ABS(fVar177 * fVar178));
                    uVar55 = -(uint)(ABS(fVar131 * fVar211) <= ABS(fVar180 * fVar181));
                    uVar59 = -(uint)(ABS(fVar132 * fVar212) <= ABS(fVar182 * fVar183));
                    uVar62 = -(uint)(ABS(fVar133 * fVar213) <= ABS(fVar184 * fVar185));
                    uVar52 = -(uint)(ABS(fVar134 * auVar165._0_4_) <= ABS(local_fa8 * fVar122));
                    uVar56 = -(uint)(ABS(fVar148 * auVar165._4_4_) <= ABS(fStack_fa4 * fVar131));
                    uVar60 = -(uint)(ABS(fVar149 * auVar165._8_4_) <= ABS(fStack_fa0 * fVar132));
                    uVar63 = -(uint)(ABS(fVar150 * auVar165._12_4_) <= ABS(fStack_f9c * fVar133));
                    local_1288._4_4_ = fVar196;
                    local_1288._0_4_ = fVar190;
                    local_1288._8_4_ = fVar161;
                    local_1288._12_4_ = fVar160;
                    local_1228[0] =
                         (float)(~uVar57 & (uint)(local_fa8 * fVar178 - local_f98 * fVar134) |
                                (uint)(fVar134 * fVar210 - fVar178 * fVar103) & uVar57);
                    local_1228[1] =
                         (float)(~uVar54 & (uint)(fStack_fa4 * fVar181 - fStack_f94 * fVar148) |
                                (uint)(fVar148 * fVar211 - fVar181 * fVar119) & uVar54);
                    local_1228[2] =
                         (float)(~uVar58 & (uint)(fStack_fa0 * fVar183 - fStack_f90 * fVar149) |
                                (uint)(fVar149 * fVar212 - fVar183 * fVar120) & uVar58);
                    local_1228[3] =
                         (float)(~uVar61 & (uint)(fStack_f9c * fVar185 - fStack_f8c * fVar150) |
                                (uint)(fVar150 * fVar213 - fVar185 * fVar121) & uVar61);
                    local_1218[0] =
                         (float)(~uVar51 & (uint)(local_f98 * fVar122 - fVar177 * fVar178) |
                                (uint)(fVar178 * auVar165._0_4_ - fVar122 * fVar210) & uVar51);
                    local_1218[1] =
                         (float)(~uVar55 & (uint)(fStack_f94 * fVar131 - fVar180 * fVar181) |
                                (uint)(fVar181 * auVar165._4_4_ - fVar131 * fVar211) & uVar55);
                    local_1218[2] =
                         (float)(~uVar59 & (uint)(fStack_f90 * fVar132 - fVar182 * fVar183) |
                                (uint)(fVar183 * auVar165._8_4_ - fVar132 * fVar212) & uVar59);
                    local_1218[3] =
                         (float)(~uVar62 & (uint)(fStack_f8c * fVar133 - fVar184 * fVar185) |
                                (uint)(fVar185 * auVar165._12_4_ - fVar133 * fVar213) & uVar62);
                    local_1208._0_4_ =
                         ~uVar52 & (uint)(fVar177 * fVar134 - local_fa8 * fVar122) |
                         (uint)(fVar122 * fVar103 - fVar134 * auVar165._0_4_) & uVar52;
                    local_1208._4_4_ =
                         ~uVar56 & (uint)(fVar180 * fVar148 - fStack_fa4 * fVar131) |
                         (uint)(fVar131 * fVar119 - fVar148 * auVar165._4_4_) & uVar56;
                    fStack_1200 = (float)(~uVar60 & (uint)(fVar182 * fVar149 - fStack_fa0 * fVar132)
                                         | (uint)(fVar132 * fVar120 - fVar149 * auVar165._8_4_) &
                                           uVar60);
                    fStack_11fc = (float)(~uVar63 & (uint)(fVar184 * fVar150 - fStack_f9c * fVar133)
                                         | (uint)(fVar133 * fVar121 - fVar150 * auVar165._12_4_) &
                                           uVar63);
                    fVar168 = fVar173 * local_1228[0] +
                              fStack_1300 * local_1218[0] +
                              local_1394.m128[3] * (float)local_1208._0_4_;
                    fVar189 = fVar173 * local_1228[1] +
                              fStack_1300 * local_1218[1] +
                              local_1394.m128[3] * (float)local_1208._4_4_;
                    fVar103 = fVar173 * local_1228[2] +
                              fStack_1300 * local_1218[2] + local_1394.m128[3] * fStack_1200;
                    fVar173 = fVar173 * local_1228[3] +
                              fStack_1300 * local_1218[3] + local_1394.m128[3] * fStack_11fc;
                    auVar170._0_4_ = fVar168 + fVar168;
                    auVar170._4_4_ = fVar189 + fVar189;
                    auVar170._8_4_ = fVar103 + fVar103;
                    auVar170._12_4_ = fVar173 + fVar173;
                    auVar110._0_4_ =
                         local_11c8 * local_1218[0] +
                         (float)local_11a8._0_4_ * (float)local_1208._0_4_;
                    auVar110._4_4_ =
                         fStack_11c4 * local_1218[1] +
                         (float)local_11a8._4_4_ * (float)local_1208._4_4_;
                    auVar110._8_4_ = fStack_11c0 * local_1218[2] + fStack_11a0 * fStack_1200;
                    auVar110._12_4_ = fStack_11bc * local_1218[3] + fStack_119c * fStack_11fc;
                    fVar119 = (float)local_11b8._0_4_ * local_1228[0] + auVar110._0_4_;
                    fVar120 = (float)local_11b8._4_4_ * local_1228[1] + auVar110._4_4_;
                    fVar121 = fStack_11b0 * local_1228[2] + auVar110._8_4_;
                    fVar122 = fStack_11ac * local_1228[3] + auVar110._12_4_;
                    auVar104 = rcpps(auVar110,auVar170);
                    fVar168 = auVar104._0_4_;
                    fVar189 = auVar104._4_4_;
                    fVar173 = auVar104._8_4_;
                    fVar103 = auVar104._12_4_;
                    local_1238[0] =
                         ((1.0 - auVar170._0_4_ * fVar168) * fVar168 + fVar168) *
                         (fVar119 + fVar119);
                    local_1238[1] =
                         ((1.0 - auVar170._4_4_ * fVar189) * fVar189 + fVar189) *
                         (fVar120 + fVar120);
                    local_1238[2] =
                         ((1.0 - auVar170._8_4_ * fVar173) * fVar173 + fVar173) *
                         (fVar121 + fVar121);
                    local_1238[3] =
                         ((1.0 - auVar170._12_4_ * fVar103) * fVar103 + fVar103) *
                         (fVar122 + fVar122);
                    fVar168 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar171._0_4_ =
                         (int)((uint)((local_1238[0] <= fVar147 && fVar168 <= local_1238[0]) &&
                                     auVar170._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar171._4_4_ =
                         (int)((uint)((local_1238[1] <= fVar147 && fVar168 <= local_1238[1]) &&
                                     auVar170._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar171._8_4_ =
                         (int)((uint)((local_1238[2] <= fVar147 && fVar168 <= local_1238[2]) &&
                                     auVar170._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar171._12_4_ =
                         (int)((uint)((local_1238[3] <= fVar147 && fVar168 <= local_1238[3]) &&
                                     auVar170._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar172 = auVar171 & auVar156;
                    uVar57 = movmskps(uVar38,auVar172);
                    pRVar40 = (RTCRayQueryContext *)(ulong)uVar57;
                    if (uVar57 != 0) {
                      local_1268 = auVar172;
                      fVar147 = (float)(int)(*(ushort *)(uVar45 + 8 + lVar49) - 1);
                      auVar104 = rcpss(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                      uVar57 = *(ushort *)(uVar45 + 10 + lVar49) - 1;
                      pRVar40 = (RTCRayQueryContext *)(ulong)uVar57;
                      auVar166._4_12_ = auVar165._4_12_;
                      auVar166._0_4_ = (float)(int)uVar57;
                      fVar147 = (2.0 - fVar147 * auVar104._0_4_) * auVar104._0_4_;
                      auVar157._4_4_ = auVar165._4_4_;
                      auVar157._0_4_ = auVar166._0_4_;
                      auVar157._8_4_ = auVar165._8_4_;
                      auVar157._12_4_ = auVar165._12_4_;
                      auVar104 = rcpss(auVar157,auVar166);
                      fStack_128c = (2.0 - auVar166._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                      auVar141._0_4_ = (float)uVar38 * fVar190 + fVar203;
                      auVar141._4_4_ = (float)(uVar38 + 1) * fVar196 + fVar205;
                      auVar141._8_4_ = (float)(uVar38 + 1) * fVar161 + local_fb8._8_4_;
                      auVar141._12_4_ = (float)uVar38 * fVar160 + local_fb8._12_4_;
                      local_12a8._4_4_ = fVar147 * auVar141._4_4_;
                      local_12a8._0_4_ = fVar147 * auVar141._0_4_;
                      fStack_12a0 = fVar147 * auVar141._8_4_;
                      fStack_129c = fVar147 * auVar141._12_4_;
                      local_1298 = fStack_128c * ((float)uVar41 * fVar190 + fVar206);
                      fStack_1294 = fStack_128c * ((float)uVar41 * fVar196 + fVar207);
                      fStack_1290 = fStack_128c * ((float)(uVar41 + 1) * fVar161 + fVar208);
                      fStack_128c = fStack_128c * ((float)(uVar41 + 1) * fVar160 + fVar209);
                      pGVar12 = (local_10a8->geometries).items[uVar50].ptr;
                      uVar57 = (ray->super_RayK<1>).mask;
                      uVar46 = (ulong)uVar57;
                      if ((pGVar12->mask & uVar57) != 0) {
                        _local_1358 = auVar172;
                        auVar104 = rcpps(auVar141,local_1288);
                        fVar168 = auVar104._0_4_;
                        fVar189 = auVar104._4_4_;
                        fVar173 = auVar104._8_4_;
                        fVar103 = auVar104._12_4_;
                        fVar190 = (float)(-(uint)(1e-18 <= local_fd8) &
                                         (uint)(((float)DAT_01feca10 - fVar190 * fVar168) * fVar168
                                               + fVar168));
                        fVar196 = (float)(-(uint)(1e-18 <= fStack_fd4) &
                                         (uint)((DAT_01feca10._4_4_ - fVar196 * fVar189) * fVar189 +
                                               fVar189));
                        fVar161 = (float)(-(uint)(1e-18 <= fStack_fd0) &
                                         (uint)((DAT_01feca10._8_4_ - fVar161 * fVar173) * fVar173 +
                                               fVar173));
                        fVar160 = (float)(-(uint)(1e-18 <= fStack_fcc) &
                                         (uint)((DAT_01feca10._12_4_ - fVar160 * fVar103) * fVar103
                                               + fVar103));
                        auVar82._0_4_ = fVar147 * auVar141._0_4_ * fVar190;
                        auVar82._4_4_ = fVar147 * auVar141._4_4_ * fVar196;
                        auVar82._8_4_ = fVar147 * auVar141._8_4_ * fVar161;
                        auVar82._12_4_ = fVar147 * auVar141._12_4_ * fVar160;
                        local_1258 = minps(auVar82,_DAT_01feca10);
                        auVar111._0_4_ = local_1298 * fVar190;
                        auVar111._4_4_ = fStack_1294 * fVar196;
                        auVar111._8_4_ = fStack_1290 * fVar161;
                        auVar111._12_4_ = fStack_128c * fVar160;
                        local_1248 = minps(auVar111,_DAT_01feca10);
                        auVar28._4_4_ = local_1238[1];
                        auVar28._0_4_ = local_1238[0];
                        auVar28._8_4_ = local_1238[2];
                        auVar28._12_4_ = local_1238[3];
                        auVar127 = ~auVar172 & _DAT_01feb9f0 | auVar28 & auVar172;
                        auVar142._4_4_ = auVar127._0_4_;
                        auVar142._0_4_ = auVar127._4_4_;
                        auVar142._8_4_ = auVar127._12_4_;
                        auVar142._12_4_ = auVar127._8_4_;
                        auVar104 = minps(auVar142,auVar127);
                        auVar83._0_8_ = auVar104._8_8_;
                        auVar83._8_4_ = auVar104._0_4_;
                        auVar83._12_4_ = auVar104._4_4_;
                        auVar104 = minps(auVar83,auVar104);
                        auVar84._0_8_ =
                             CONCAT44(-(uint)(auVar104._4_4_ == auVar127._4_4_) & auVar172._4_4_,
                                      -(uint)(auVar104._0_4_ == auVar127._0_4_) & auVar172._0_4_);
                        auVar84._8_4_ = -(uint)(auVar104._8_4_ == auVar127._8_4_) & auVar172._8_4_;
                        auVar84._12_4_ =
                             -(uint)(auVar104._12_4_ == auVar127._12_4_) & auVar172._12_4_;
                        iVar42 = movmskps(uVar57,auVar84);
                        if (iVar42 != 0) {
                          auVar172._8_4_ = auVar84._8_4_;
                          auVar172._0_8_ = auVar84._0_8_;
                          auVar172._12_4_ = auVar84._12_4_;
                        }
                        uVar57 = movmskps(iVar42,auVar172);
                        lVar36 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                          }
                        }
                        pRVar14 = *(RTCIntersectArguments **)(local_1394._4_8_ + 0x10);
                        if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar160 = *(float *)(local_1258 + lVar36 * 4);
                          fVar147 = local_1238[lVar36 + -4];
                          fVar190 = local_1228[lVar36];
                          fVar196 = local_1218[lVar36];
                          fVar161 = *(float *)(local_1208 + lVar36 * 4);
                          (ray->super_RayK<1>).tfar = local_1238[lVar36];
                          (ray->Ng).field_0.field_0.x = fVar190;
                          (ray->Ng).field_0.field_0.y = fVar196;
                          (ray->Ng).field_0.field_0.z = fVar161;
                          ray->u = fVar160;
                          ray->v = fVar147;
                          ray->primID = uVar53;
                          ray->geomID = uVar50;
                          pRVar15 = *(RTCRayQueryContext **)(local_1394._4_8_ + 8);
                          uVar53 = pRVar15->instID[0];
                          pRVar40 = (RTCRayQueryContext *)(ulong)uVar53;
                          ray->instID[0] = uVar53;
                          uVar53 = pRVar15->instPrimID[0];
                          uVar46 = (ulong)uVar53;
                          ray->instPrimID[0] = uVar53;
                        }
                        else {
                          local_1308 = *(RTCRayQueryContext **)(local_1394._4_8_ + 8);
                          local_1318._8_8_ = 0;
                          local_1318._0_8_ = uVar45;
                          do {
                            local_12dc = *(undefined4 *)(local_1258 + lVar36 * 4);
                            local_12d8 = local_1238[lVar36 + -4];
                            local_1394.m128[3] = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1238[lVar36];
                            local_12e8 = local_1228[lVar36];
                            local_12e4 = local_1218[lVar36];
                            local_12e0 = *(undefined4 *)(local_1208 + lVar36 * 4);
                            local_12d4 = (int)local_1370;
                            local_12d0 = uVar50;
                            local_12cc = local_1308->instID[0];
                            local_12c8 = local_1308->instPrimID[0];
                            local_1394.m128[0] = -NAN;
                            local_1348.valid = (int *)&local_1394;
                            local_1348.geometryUserPtr = pGVar12->userPtr;
                            local_1348.context = local_1308;
                            local_1348.ray = (RTCRayN *)ray;
                            local_1348.hit = (RTCHitN *)&local_12e8;
                            local_1348.N = 1;
                            pRVar40 = local_1308;
                            if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e0f775:
                              if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar14->filter)(&local_1348);
                                  uVar45 = local_1318._0_8_;
                                  context = (RayQueryContext *)local_1394._4_8_;
                                }
                                if (*(float *)local_1348.valid == 0.0) goto LAB_00e0f80c;
                              }
                              *(float *)((long)local_1348.ray + 0x30) = *(float *)local_1348.hit;
                              *(float *)((long)local_1348.ray + 0x34) =
                                   *(float *)(local_1348.hit + 4);
                              *(float *)((long)local_1348.ray + 0x38) =
                                   *(float *)(local_1348.hit + 8);
                              *(float *)((long)local_1348.ray + 0x3c) =
                                   *(float *)(local_1348.hit + 0xc);
                              *(float *)((long)local_1348.ray + 0x40) =
                                   *(float *)(local_1348.hit + 0x10);
                              *(float *)((long)local_1348.ray + 0x44) =
                                   *(float *)(local_1348.hit + 0x14);
                              *(float *)((long)local_1348.ray + 0x48) =
                                   *(float *)(local_1348.hit + 0x18);
                              *(float *)((long)local_1348.ray + 0x4c) =
                                   *(float *)(local_1348.hit + 0x1c);
                              pRVar40 = (RTCRayQueryContext *)
                                        (ulong)(uint)*(float *)(local_1348.hit + 0x20);
                              *(float *)((long)local_1348.ray + 0x50) =
                                   *(float *)(local_1348.hit + 0x20);
                              paVar37 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.ray;
                            }
                            else {
                              (*pGVar12->intersectionFilterN)(&local_1348);
                              uVar45 = local_1318._0_8_;
                              context = (RayQueryContext *)local_1394._4_8_;
                              if (*(float *)local_1348.valid != 0.0) goto LAB_00e0f775;
LAB_00e0f80c:
                              (ray->super_RayK<1>).tfar = local_1394.m128[3];
                              paVar37 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.valid;
                            }
                            *(undefined4 *)(local_1358 + lVar36 * 4) = 0;
                            fVar147 = (ray->super_RayK<1>).tfar;
                            auVar91._0_4_ = -(uint)(local_1238[0] <= fVar147) & local_1358._0_4_;
                            auVar91._4_4_ = -(uint)(local_1238[1] <= fVar147) & local_1358._4_4_;
                            auVar91._8_4_ = -(uint)(local_1238[2] <= fVar147) & uStack_1350;
                            auVar91._12_4_ = -(uint)(local_1238[3] <= fVar147) & uStack_134c;
                            _local_1358 = auVar91;
                            uVar53 = movmskps((int)paVar37,auVar91);
                            uVar46 = (ulong)uVar53;
                            if (uVar53 != 0) {
                              auVar113._0_4_ = (uint)local_1238[0] & auVar91._0_4_;
                              auVar113._4_4_ = (uint)local_1238[1] & auVar91._4_4_;
                              auVar113._8_4_ = (uint)local_1238[2] & auVar91._8_4_;
                              auVar113._12_4_ = (uint)local_1238[3] & auVar91._12_4_;
                              auVar129._0_8_ =
                                   CONCAT44(~auVar91._4_4_,~auVar91._0_4_) & 0x7f8000007f800000;
                              auVar129._8_4_ = ~auVar91._8_4_ & 0x7f800000;
                              auVar129._12_4_ = ~auVar91._12_4_ & 0x7f800000;
                              auVar129 = auVar129 | auVar113;
                              auVar145._4_4_ = auVar129._0_4_;
                              auVar145._0_4_ = auVar129._4_4_;
                              auVar145._8_4_ = auVar129._12_4_;
                              auVar145._12_4_ = auVar129._8_4_;
                              auVar104 = minps(auVar145,auVar129);
                              auVar114._0_8_ = auVar104._8_8_;
                              auVar114._8_4_ = auVar104._0_4_;
                              auVar114._12_4_ = auVar104._4_4_;
                              auVar104 = minps(auVar114,auVar104);
                              auVar115._0_8_ =
                                   CONCAT44(-(uint)(auVar104._4_4_ == auVar129._4_4_) &
                                            auVar91._4_4_,
                                            -(uint)(auVar104._0_4_ == auVar129._0_4_) &
                                            auVar91._0_4_);
                              auVar115._8_4_ =
                                   -(uint)(auVar104._8_4_ == auVar129._8_4_) & auVar91._8_4_;
                              auVar115._12_4_ =
                                   -(uint)(auVar104._12_4_ == auVar129._12_4_) & auVar91._12_4_;
                              iVar42 = movmskps((int)pRVar40,auVar115);
                              if (iVar42 != 0) {
                                auVar91._8_4_ = auVar115._8_4_;
                                auVar91._0_8_ = auVar115._0_8_;
                                auVar91._12_4_ = auVar115._12_4_;
                              }
                              uVar35 = movmskps(iVar42,auVar91);
                              pRVar40 = (RTCRayQueryContext *)
                                        CONCAT44((int)((ulong)pRVar40 >> 0x20),uVar35);
                              lVar36 = 0;
                              if (pRVar40 != (RTCRayQueryContext *)0x0) {
                                for (; ((ulong)pRVar40 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                                }
                              }
                            }
                          } while ((char)uVar53 != '\0');
                        }
                      }
                    }
                  }
                  fVar147 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar190 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar196 = (ray->super_RayK<1>).org.field_0.m128[2];
                  fStack_1300 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar161 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_1394.m128[3] = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1308 = (RTCRayQueryContext *)CONCAT44(fStack_1300,fStack_1300);
                  fStack_12fc = fStack_1300;
                  local_1148._0_4_ = (float)local_1148 - fVar147;
                  local_1148._4_4_ = local_1148._4_4_ - fVar147;
                  fStack_1140 = fStack_1140 - fVar147;
                  fStack_113c = fStack_113c - fVar147;
                  local_1158 = local_1158 - fVar190;
                  fStack_1154 = fStack_1154 - fVar190;
                  fStack_1150 = fStack_1150 - fVar190;
                  fStack_114c = fStack_114c - fVar190;
                  local_1168 = local_1168 - fVar196;
                  fStack_1164 = fStack_1164 - fVar196;
                  fStack_1160 = fStack_1160 - fVar196;
                  fStack_115c = fStack_115c - fVar196;
                  fVar120 = (float)local_12b8._0_4_ - fVar147;
                  fVar131 = (float)local_12b8._4_4_ - fVar147;
                  fVar134 = fStack_12b0 - fVar147;
                  fVar150 = fStack_12ac - fVar147;
                  fVar121 = (float)local_12f8._0_4_ - fVar190;
                  fVar132 = (float)local_12f8._4_4_ - fVar190;
                  fVar148 = fStack_12f0 - fVar190;
                  fVar151 = fStack_12ec - fVar190;
                  fVar122 = (float)local_1368 - fVar196;
                  fVar133 = local_1368._4_4_ - fVar196;
                  fVar149 = fStack_1360 - fVar196;
                  fVar158 = fStack_135c - fVar196;
                  fVar206 = (float)local_1198 - fVar147;
                  fVar207 = local_1198._4_4_ - fVar147;
                  fVar208 = fStack_1190 - fVar147;
                  fVar147 = fStack_118c - fVar147;
                  fVar202 = local_1188 - fVar190;
                  fVar203 = fStack_1184 - fVar190;
                  fVar205 = fStack_1180 - fVar190;
                  fVar190 = fStack_117c - fVar190;
                  fVar199 = (float)local_1178 - fVar196;
                  fVar200 = local_1178._4_4_ - fVar196;
                  fVar201 = fStack_1170 - fVar196;
                  fVar196 = fStack_116c - fVar196;
                  fVar160 = fVar206 - (float)local_1148;
                  fVar168 = fVar207 - local_1148._4_4_;
                  fStack_1170 = fVar208 - fStack_1140;
                  fStack_116c = fVar147 - fStack_113c;
                  fVar177 = fVar202 - local_1158;
                  fVar180 = fVar203 - fStack_1154;
                  fStack_1190 = fVar205 - fStack_1150;
                  fStack_118c = fVar190 - fStack_114c;
                  local_1188 = fVar199 - local_1168;
                  fStack_1184 = fVar200 - fStack_1164;
                  fStack_1180 = fVar201 - fStack_1160;
                  fStack_117c = fVar196 - fStack_115c;
                  fStack_1384 = local_1394.m128[3];
                  fStack_1380 = local_1394.m128[3];
                  fStack_137c = local_1394.m128[3];
                  local_1198 = CONCAT44(fVar180,fVar177);
                  local_1178 = CONCAT44(fVar168,fVar160);
                  fVar178 = local_1158 - fVar121;
                  fVar181 = fStack_1154 - fVar132;
                  fVar182 = fStack_1150 - fVar148;
                  fVar183 = fStack_114c - fVar151;
                  fVar184 = local_1168 - fVar122;
                  fVar187 = fStack_1164 - fVar133;
                  fVar192 = fStack_1160 - fVar149;
                  fVar194 = fStack_115c - fVar158;
                  fVar197 = (fVar177 * (fVar199 + local_1168) - local_1188 * (fVar202 + local_1158))
                            * fStack_1300 +
                            (local_1188 * (fVar206 + (float)local_1148) -
                            (fVar199 + local_1168) * fVar160) * fVar161 +
                            ((fVar202 + local_1158) * fVar160 -
                            (fVar206 + (float)local_1148) * fVar177) * local_1394.m128[3];
                  fVar198 = (fVar180 * (fVar200 + fStack_1164) -
                            fStack_1184 * (fVar203 + fStack_1154)) * fStack_1300 +
                            (fStack_1184 * (fVar207 + local_1148._4_4_) -
                            (fVar200 + fStack_1164) * fVar168) * fVar161 +
                            ((fVar203 + fStack_1154) * fVar168 -
                            (fVar207 + local_1148._4_4_) * fVar180) * local_1394.m128[3];
                  local_12f8 = (undefined1  [8])CONCAT44(fVar198,fVar197);
                  fStack_12f0 = (fStack_1190 * (fVar201 + fStack_1160) -
                                fStack_1180 * (fVar205 + fStack_1150)) * fStack_1300 +
                                (fStack_1180 * (fVar208 + fStack_1140) -
                                (fVar201 + fStack_1160) * fStack_1170) * fVar161 +
                                ((fVar205 + fStack_1150) * fStack_1170 -
                                (fVar208 + fStack_1140) * fStack_1190) * local_1394.m128[3];
                  fStack_12ec = (fStack_118c * (fVar196 + fStack_115c) -
                                fStack_117c * (fVar190 + fStack_114c)) * fStack_1300 +
                                (fStack_117c * (fVar147 + fStack_113c) -
                                (fVar196 + fStack_115c) * fStack_116c) * fVar161 +
                                ((fVar190 + fStack_114c) * fStack_116c -
                                (fVar147 + fStack_113c) * fStack_118c) * local_1394.m128[3];
                  fVar159 = (float)local_1148 - fVar120;
                  fVar174 = local_1148._4_4_ - fVar131;
                  fVar175 = fStack_1140 - fVar134;
                  fVar176 = fStack_113c - fVar150;
                  local_12b8._0_4_ =
                       (fVar178 * (local_1168 + fVar122) - fVar184 * (local_1158 + fVar121)) *
                       fStack_1300 +
                       (fVar184 * ((float)local_1148 + fVar120) - (local_1168 + fVar122) * fVar159)
                       * fVar161 +
                       ((local_1158 + fVar121) * fVar159 - ((float)local_1148 + fVar120) * fVar178)
                       * local_1394.m128[3];
                  local_12b8._4_4_ =
                       (fVar181 * (fStack_1164 + fVar133) - fVar187 * (fStack_1154 + fVar132)) *
                       fStack_1300 +
                       (fVar187 * (local_1148._4_4_ + fVar131) - (fStack_1164 + fVar133) * fVar174)
                       * fVar161 +
                       ((fStack_1154 + fVar132) * fVar174 - (local_1148._4_4_ + fVar131) * fVar181)
                       * local_1394.m128[3];
                  fStack_12b0 = (fVar182 * (fStack_1160 + fVar149) -
                                fVar192 * (fStack_1150 + fVar148)) * fStack_1300 +
                                (fVar192 * (fStack_1140 + fVar134) -
                                (fStack_1160 + fVar149) * fVar175) * fVar161 +
                                ((fStack_1150 + fVar148) * fVar175 -
                                (fStack_1140 + fVar134) * fVar182) * local_1394.m128[3];
                  fStack_12ac = (fVar183 * (fStack_115c + fVar158) -
                                fVar194 * (fStack_114c + fVar151)) * fStack_1300 +
                                (fVar194 * (fStack_113c + fVar150) -
                                (fStack_115c + fVar158) * fVar176) * fVar161 +
                                ((fStack_114c + fVar151) * fVar176 -
                                (fStack_113c + fVar150) * fVar183) * local_1394.m128[3];
                  fVar189 = fVar120 - fVar206;
                  fVar173 = fVar131 - fVar207;
                  fVar103 = fVar134 - fVar208;
                  fVar119 = fVar150 - fVar147;
                  local_11b8._0_4_ = fVar121 - fVar202;
                  local_11b8._4_4_ = fVar132 - fVar203;
                  fStack_11b0 = fVar148 - fVar205;
                  fStack_11ac = fVar151 - fVar190;
                  fVar185 = fVar122 - fVar199;
                  fVar188 = fVar133 - fVar200;
                  fVar193 = fVar149 - fVar201;
                  fVar195 = fVar158 - fVar196;
                  local_1368._0_4_ = fVar161;
                  local_1368._4_4_ = fVar161;
                  fStack_1360 = fVar161;
                  fStack_135c = fVar161;
                  auVar191._0_4_ =
                       ((float)local_11b8._0_4_ * (fVar199 + fVar122) -
                       fVar185 * (fVar202 + fVar121)) * fStack_1300 +
                       (fVar185 * (fVar206 + fVar120) - (fVar199 + fVar122) * fVar189) * fVar161 +
                       ((fVar202 + fVar121) * fVar189 -
                       (fVar206 + fVar120) * (float)local_11b8._0_4_) * local_1394.m128[3];
                  auVar191._4_4_ =
                       ((float)local_11b8._4_4_ * (fVar200 + fVar133) -
                       fVar188 * (fVar203 + fVar132)) * fStack_1300 +
                       (fVar188 * (fVar207 + fVar131) - (fVar200 + fVar133) * fVar173) * fVar161 +
                       ((fVar203 + fVar132) * fVar173 -
                       (fVar207 + fVar131) * (float)local_11b8._4_4_) * local_1394.m128[3];
                  auVar191._8_4_ =
                       (fStack_11b0 * (fVar201 + fVar149) - fVar193 * (fVar205 + fVar148)) *
                       fStack_1300 +
                       (fVar193 * (fVar208 + fVar134) - (fVar201 + fVar149) * fVar103) * fVar161 +
                       ((fVar205 + fVar148) * fVar103 - (fVar208 + fVar134) * fStack_11b0) *
                       local_1394.m128[3];
                  auVar191._12_4_ =
                       (fStack_11ac * (fVar196 + fVar158) - fVar195 * (fVar190 + fVar151)) *
                       fStack_1300 +
                       (fVar195 * (fVar147 + fVar150) - (fVar196 + fVar158) * fVar119) * fVar161 +
                       ((fVar190 + fVar151) * fVar119 - (fVar147 + fVar150) * fStack_11ac) *
                       local_1394.m128[3];
                  local_1318._0_4_ = fVar197 + (float)local_12b8._0_4_ + auVar191._0_4_;
                  local_1318._4_4_ = fVar198 + (float)local_12b8._4_4_ + auVar191._4_4_;
                  local_1318._8_4_ = fStack_12f0 + fStack_12b0 + auVar191._8_4_;
                  local_1318._12_4_ = fStack_12ec + fStack_12ac + auVar191._12_4_;
                  auVar204._8_4_ = fStack_12f0;
                  auVar204._0_8_ = local_12f8;
                  auVar204._12_4_ = fStack_12ec;
                  auVar104 = minps(auVar204,_local_12b8);
                  auVar127 = minps(auVar104,auVar191);
                  auVar104 = maxps(_local_12f8,_local_12b8);
                  auVar104 = maxps(auVar104,auVar191);
                  local_11c8 = ABS(local_1318._0_4_);
                  fStack_11c4 = ABS(local_1318._4_4_);
                  fStack_11c0 = ABS(local_1318._8_4_);
                  fStack_11bc = ABS(local_1318._12_4_);
                  local_11a8._0_4_ =
                       -(uint)(auVar104._0_4_ <= local_11c8 * 1.1920929e-07 ||
                              -(local_11c8 * 1.1920929e-07) <= auVar127._0_4_) & local_1008;
                  local_11a8._4_4_ =
                       -(uint)(auVar104._4_4_ <= fStack_11c4 * 1.1920929e-07 ||
                              -(fStack_11c4 * 1.1920929e-07) <= auVar127._4_4_) & uStack_1004;
                  fStack_11a0 = (float)(-(uint)(auVar104._8_4_ <= fStack_11c0 * 1.1920929e-07 ||
                                               -(fStack_11c0 * 1.1920929e-07) <= auVar127._8_4_) &
                                       uStack_1000);
                  fStack_119c = (float)(-(uint)(auVar104._12_4_ <= fStack_11bc * 1.1920929e-07 ||
                                               -(fStack_11bc * 1.1920929e-07) <= auVar127._12_4_) &
                                       uStack_ffc);
                  iVar42 = movmskps((int)uVar46,_local_11a8);
                  uVar46 = local_10b8;
                  if (iVar42 != 0) {
                    uVar53 = -(uint)(ABS(fVar184 * (float)local_11b8._0_4_) <=
                                    ABS(local_1188 * fVar178));
                    uVar41 = -(uint)(ABS(fVar187 * (float)local_11b8._4_4_) <=
                                    ABS(fStack_1184 * fVar181));
                    uVar54 = -(uint)(ABS(fVar192 * fStack_11b0) <= ABS(fStack_1180 * fVar182));
                    uVar58 = -(uint)(ABS(fVar194 * fStack_11ac) <= ABS(fStack_117c * fVar183));
                    uVar57 = -(uint)(ABS(fVar159 * fVar185) <= ABS(fVar160 * fVar184));
                    uVar51 = -(uint)(ABS(fVar174 * fVar188) <= ABS(fVar168 * fVar187));
                    uVar55 = -(uint)(ABS(fVar175 * fVar193) <= ABS(fStack_1170 * fVar192));
                    uVar59 = -(uint)(ABS(fVar176 * fVar195) <= ABS(fStack_116c * fVar194));
                    uVar38 = -(uint)(ABS(fVar178 * fVar189) <= ABS(fVar177 * fVar159));
                    uVar52 = -(uint)(ABS(fVar181 * fVar173) <= ABS(fVar180 * fVar174));
                    uVar56 = -(uint)(ABS(fVar182 * fVar103) <= ABS(fStack_1190 * fVar175));
                    uVar60 = -(uint)(ABS(fVar183 * fVar119) <= ABS(fStack_118c * fVar176));
                    local_1228[0] =
                         (float)(~uVar53 & (uint)(fVar177 * fVar184 - local_1188 * fVar178) |
                                (uint)(fVar178 * fVar185 - fVar184 * (float)local_11b8._0_4_) &
                                uVar53);
                    local_1228[1] =
                         (float)(~uVar41 & (uint)(fVar180 * fVar187 - fStack_1184 * fVar181) |
                                (uint)(fVar181 * fVar188 - fVar187 * (float)local_11b8._4_4_) &
                                uVar41);
                    local_1228[2] =
                         (float)(~uVar54 & (uint)(fStack_1190 * fVar192 - fStack_1180 * fVar182) |
                                (uint)(fVar182 * fVar193 - fVar192 * fStack_11b0) & uVar54);
                    local_1228[3] =
                         (float)(~uVar58 & (uint)(fStack_118c * fVar194 - fStack_117c * fVar183) |
                                (uint)(fVar183 * fVar195 - fVar194 * fStack_11ac) & uVar58);
                    local_1218[0] =
                         (float)(~uVar57 & (uint)(local_1188 * fVar159 - fVar160 * fVar184) |
                                (uint)(fVar184 * fVar189 - fVar159 * fVar185) & uVar57);
                    local_1218[1] =
                         (float)(~uVar51 & (uint)(fStack_1184 * fVar174 - fVar168 * fVar187) |
                                (uint)(fVar187 * fVar173 - fVar174 * fVar188) & uVar51);
                    local_1218[2] =
                         (float)(~uVar55 & (uint)(fStack_1180 * fVar175 - fStack_1170 * fVar192) |
                                (uint)(fVar192 * fVar103 - fVar175 * fVar193) & uVar55);
                    local_1218[3] =
                         (float)(~uVar59 & (uint)(fStack_117c * fVar176 - fStack_116c * fVar194) |
                                (uint)(fVar194 * fVar119 - fVar176 * fVar195) & uVar59);
                    auVar167._0_4_ =
                         (uint)(fVar159 * (float)local_11b8._0_4_ - fVar178 * fVar189) & uVar38;
                    auVar167._4_4_ =
                         (uint)(fVar174 * (float)local_11b8._4_4_ - fVar181 * fVar173) & uVar52;
                    auVar167._8_4_ = (uint)(fVar175 * fStack_11b0 - fVar182 * fVar103) & uVar56;
                    auVar167._12_4_ = (uint)(fVar176 * fStack_11ac - fVar183 * fVar119) & uVar60;
                    auVar179._0_4_ = ~uVar38 & (uint)(fVar160 * fVar178 - fVar177 * fVar159);
                    auVar179._4_4_ = ~uVar52 & (uint)(fVar168 * fVar181 - fVar180 * fVar174);
                    auVar179._8_4_ = ~uVar56 & (uint)(fStack_1170 * fVar182 - fStack_1190 * fVar175)
                    ;
                    auVar179._12_4_ =
                         ~uVar60 & (uint)(fStack_116c * fVar183 - fStack_118c * fVar176);
                    _local_1208 = auVar179 | auVar167;
                    auVar128._0_4_ = fVar161 * local_1218[0] + local_1394.m128[3] * local_1208._0_4_
                    ;
                    auVar128._4_4_ = fVar161 * local_1218[1] + local_1394.m128[3] * local_1208._4_4_
                    ;
                    auVar128._8_4_ = fVar161 * local_1218[2] + local_1394.m128[3] * local_1208._8_4_
                    ;
                    auVar128._12_4_ =
                         fVar161 * local_1218[3] + local_1394.m128[3] * local_1208._12_4_;
                    fVar147 = fStack_1300 * local_1228[0] + auVar128._0_4_;
                    fVar190 = fStack_1300 * local_1228[1] + auVar128._4_4_;
                    fVar196 = fStack_1300 * local_1228[2] + auVar128._8_4_;
                    fVar161 = fStack_1300 * local_1228[3] + auVar128._12_4_;
                    auVar85._0_4_ = fVar147 + fVar147;
                    auVar85._4_4_ = fVar190 + fVar190;
                    auVar85._8_4_ = fVar196 + fVar196;
                    auVar85._12_4_ = fVar161 + fVar161;
                    fVar160 = (float)local_1148 * local_1228[0] +
                              local_1158 * local_1218[0] + local_1168 * local_1208._0_4_;
                    fVar168 = local_1148._4_4_ * local_1228[1] +
                              fStack_1154 * local_1218[1] + fStack_1164 * local_1208._4_4_;
                    fVar189 = fStack_1140 * local_1228[2] +
                              fStack_1150 * local_1218[2] + fStack_1160 * local_1208._8_4_;
                    fVar173 = fStack_113c * local_1228[3] +
                              fStack_114c * local_1218[3] + fStack_115c * local_1208._12_4_;
                    auVar104 = rcpps(auVar128,auVar85);
                    fVar147 = auVar104._0_4_;
                    fVar190 = auVar104._4_4_;
                    fVar196 = auVar104._8_4_;
                    fVar161 = auVar104._12_4_;
                    local_1238[0] =
                         ((1.0 - auVar85._0_4_ * fVar147) * fVar147 + fVar147) * (fVar160 + fVar160)
                    ;
                    local_1238[1] =
                         ((1.0 - auVar85._4_4_ * fVar190) * fVar190 + fVar190) * (fVar168 + fVar168)
                    ;
                    local_1238[2] =
                         ((1.0 - auVar85._8_4_ * fVar196) * fVar196 + fVar196) * (fVar189 + fVar189)
                    ;
                    local_1238[3] =
                         ((1.0 - auVar85._12_4_ * fVar161) * fVar161 + fVar161) *
                         (fVar173 + fVar173);
                    fVar147 = (ray->super_RayK<1>).tfar;
                    fVar190 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar86._0_4_ =
                         (int)((uint)(auVar85._0_4_ != 0.0 &&
                                     (local_1238[0] <= fVar147 && fVar190 <= local_1238[0])) *
                              -0x80000000) >> 0x1f;
                    auVar86._4_4_ =
                         (int)((uint)(auVar85._4_4_ != 0.0 &&
                                     (local_1238[1] <= fVar147 && fVar190 <= local_1238[1])) *
                              -0x80000000) >> 0x1f;
                    auVar86._8_4_ =
                         (int)((uint)(auVar85._8_4_ != 0.0 &&
                                     (local_1238[2] <= fVar147 && fVar190 <= local_1238[2])) *
                              -0x80000000) >> 0x1f;
                    auVar86._12_4_ =
                         (int)((uint)(auVar85._12_4_ != 0.0 &&
                                     (local_1238[3] <= fVar147 && fVar190 <= local_1238[3])) *
                              -0x80000000) >> 0x1f;
                    auVar87 = auVar86 & _local_11a8;
                    iVar42 = movmskps(iVar42,auVar87);
                    if (iVar42 != 0) {
                      local_1288 = local_1318;
                      local_1278 = &local_13a1;
                      local_1268 = auVar87;
                      fVar147 = (float)(int)(*(ushort *)(uVar45 + 8 + lVar49) - 1);
                      auVar104 = rcpss(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                      fStack_129c = (2.0 - fVar147 * auVar104._0_4_) * auVar104._0_4_;
                      fVar147 = (float)(int)(*(ushort *)(uVar45 + 10 + lVar49) - 1);
                      auVar104 = rcpss(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                      fVar147 = (2.0 - fVar147 * auVar104._0_4_) * auVar104._0_4_;
                      local_12a8._0_4_ =
                           fStack_129c *
                           ((float)(int)local_11f8._0_4_ * local_1318._0_4_ +
                           (local_1318._0_4_ - fVar197));
                      local_12a8._4_4_ =
                           fStack_129c *
                           ((float)(local_11f8._0_4_ + 1) * local_1318._4_4_ +
                           (local_1318._4_4_ - fVar198));
                      fStack_12a0 = fStack_129c *
                                    ((float)(local_11f8._0_4_ + 1) * local_1318._8_4_ +
                                    (local_1318._8_4_ - fStack_12f0));
                      fStack_129c = fStack_129c *
                                    ((float)(int)local_11f8._0_4_ * local_1318._12_4_ +
                                    (local_1318._12_4_ - fStack_12ec));
                      auVar143._0_4_ =
                           (float)(int)local_ff8._0_4_ * local_1318._0_4_ +
                           (local_1318._0_4_ - (float)local_12b8._0_4_);
                      auVar143._4_4_ =
                           (float)(int)local_ff8._0_4_ * local_1318._4_4_ +
                           (local_1318._4_4_ - (float)local_12b8._4_4_);
                      auVar143._8_4_ =
                           (float)(local_ff8._0_4_ + 1) * local_1318._8_4_ +
                           (local_1318._8_4_ - fStack_12b0);
                      auVar143._12_4_ =
                           (float)(local_ff8._0_4_ + 1) * local_1318._12_4_ +
                           (local_1318._12_4_ - fStack_12ac);
                      fStack_1294 = fVar147 * auVar143._4_4_;
                      local_1298 = fVar147 * auVar143._0_4_;
                      fStack_1290 = fVar147 * auVar143._8_4_;
                      fStack_128c = fVar147 * auVar143._12_4_;
                      pGVar12 = (context->scene->geometries).items[uVar50].ptr;
                      uVar53 = (ray->super_RayK<1>).mask;
                      if ((pGVar12->mask & uVar53) != 0) {
                        _local_1358 = auVar87;
                        auVar104 = rcpps(auVar143,local_1318);
                        fVar190 = auVar104._0_4_;
                        fVar196 = auVar104._4_4_;
                        fVar161 = auVar104._8_4_;
                        fVar160 = auVar104._12_4_;
                        fVar190 = (float)(-(uint)(1e-18 <= local_11c8) &
                                         (uint)(((float)DAT_01feca10 - local_1318._0_4_ * fVar190) *
                                                fVar190 + fVar190));
                        fVar196 = (float)(-(uint)(1e-18 <= fStack_11c4) &
                                         (uint)((DAT_01feca10._4_4_ - local_1318._4_4_ * fVar196) *
                                                fVar196 + fVar196));
                        fVar161 = (float)(-(uint)(1e-18 <= fStack_11c0) &
                                         (uint)((DAT_01feca10._8_4_ - local_1318._8_4_ * fVar161) *
                                                fVar161 + fVar161));
                        fVar160 = (float)(-(uint)(1e-18 <= fStack_11bc) &
                                         (uint)((DAT_01feca10._12_4_ - local_1318._12_4_ * fVar160)
                                                * fVar160 + fVar160));
                        auVar88._0_4_ = (float)local_12a8._0_4_ * fVar190;
                        auVar88._4_4_ = (float)local_12a8._4_4_ * fVar196;
                        auVar88._8_4_ = fStack_12a0 * fVar161;
                        auVar88._12_4_ = fStack_129c * fVar160;
                        local_1258 = minps(auVar88,_DAT_01feca10);
                        auVar112._0_4_ = fVar147 * auVar143._0_4_ * fVar190;
                        auVar112._4_4_ = fVar147 * auVar143._4_4_ * fVar196;
                        auVar112._8_4_ = fVar147 * auVar143._8_4_ * fVar161;
                        auVar112._12_4_ = fVar147 * auVar143._12_4_ * fVar160;
                        local_1248 = minps(auVar112,_DAT_01feca10);
                        auVar29._4_4_ = local_1238[1];
                        auVar29._0_4_ = local_1238[0];
                        auVar29._8_4_ = local_1238[2];
                        auVar29._12_4_ = local_1238[3];
                        auVar127 = ~auVar87 & _DAT_01feb9f0 | auVar29 & auVar87;
                        auVar144._4_4_ = auVar127._0_4_;
                        auVar144._0_4_ = auVar127._4_4_;
                        auVar144._8_4_ = auVar127._12_4_;
                        auVar144._12_4_ = auVar127._8_4_;
                        auVar104 = minps(auVar144,auVar127);
                        auVar89._0_8_ = auVar104._8_8_;
                        auVar89._8_4_ = auVar104._0_4_;
                        auVar89._12_4_ = auVar104._4_4_;
                        auVar104 = minps(auVar89,auVar104);
                        auVar90._0_8_ =
                             CONCAT44(-(uint)(auVar104._4_4_ == auVar127._4_4_) & auVar87._4_4_,
                                      -(uint)(auVar104._0_4_ == auVar127._0_4_) & auVar87._0_4_);
                        auVar90._8_4_ = -(uint)(auVar104._8_4_ == auVar127._8_4_) & auVar87._8_4_;
                        auVar90._12_4_ =
                             -(uint)(auVar104._12_4_ == auVar127._12_4_) & auVar87._12_4_;
                        iVar42 = movmskps(uVar53,auVar90);
                        if (iVar42 != 0) {
                          auVar87._8_4_ = auVar90._8_4_;
                          auVar87._0_8_ = auVar90._0_8_;
                          auVar87._12_4_ = auVar90._12_4_;
                        }
                        uVar53 = movmskps(iVar42,auVar87);
                        lVar36 = 0;
                        if (uVar53 != 0) {
                          for (; (uVar53 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                          }
                        }
                        pRVar14 = context->args;
                        if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar147 = *(float *)(local_1258 + lVar36 * 4);
                          fVar190 = local_1238[lVar36 + -4];
                          fVar196 = local_1228[lVar36];
                          fVar161 = local_1218[lVar36];
                          fVar160 = *(float *)(local_1208 + lVar36 * 4);
                          (ray->super_RayK<1>).tfar = local_1238[lVar36];
                          (ray->Ng).field_0.field_0.x = fVar196;
                          (ray->Ng).field_0.field_0.y = fVar161;
                          (ray->Ng).field_0.field_0.z = fVar160;
                          ray->u = fVar147;
                          ray->v = fVar190;
                          ray->primID = (uint)local_1370;
                          ray->geomID = uVar50;
                          pRVar40 = context->user;
                          ray->instID[0] = pRVar40->instID[0];
                          ray->instPrimID[0] = pRVar40->instPrimID[0];
                        }
                        else {
                          pRVar15 = context->user;
                          do {
                            local_12dc = *(undefined4 *)(local_1258 + lVar36 * 4);
                            local_12d8 = local_1238[lVar36 + -4];
                            local_1368._0_4_ = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1238[lVar36];
                            local_12e8 = local_1228[lVar36];
                            local_12e4 = local_1218[lVar36];
                            local_12e0 = *(undefined4 *)(local_1208 + lVar36 * 4);
                            local_12d4 = (int)local_1370;
                            local_12d0 = uVar50;
                            local_12cc = pRVar15->instID[0];
                            local_12c8 = pRVar15->instPrimID[0];
                            local_1394.m128[0] = -NAN;
                            local_1348.valid = (int *)&local_1394;
                            local_1348.geometryUserPtr = pGVar12->userPtr;
                            local_1348.context = pRVar15;
                            local_1348.ray = (RTCRayN *)ray;
                            local_1348.hit = (RTCHitN *)&local_12e8;
                            local_1348.N = 1;
                            if ((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar12->intersectionFilterN)(&local_1348),
                               context = (RayQueryContext *)local_1394._4_8_,
                               *(float *)local_1348.valid != 0.0)) {
                              if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar14->filter)(&local_1348);
                                  context = (RayQueryContext *)local_1394._4_8_;
                                }
                                if (*(float *)local_1348.valid == 0.0) goto LAB_00e0fa2b;
                              }
                              *(float *)((long)local_1348.ray + 0x30) = *(float *)local_1348.hit;
                              *(float *)((long)local_1348.ray + 0x34) =
                                   *(float *)(local_1348.hit + 4);
                              *(float *)((long)local_1348.ray + 0x38) =
                                   *(float *)(local_1348.hit + 8);
                              *(float *)((long)local_1348.ray + 0x3c) =
                                   *(float *)(local_1348.hit + 0xc);
                              *(float *)((long)local_1348.ray + 0x40) =
                                   *(float *)(local_1348.hit + 0x10);
                              *(float *)((long)local_1348.ray + 0x44) =
                                   *(float *)(local_1348.hit + 0x14);
                              *(float *)((long)local_1348.ray + 0x48) =
                                   *(float *)(local_1348.hit + 0x18);
                              *(float *)((long)local_1348.ray + 0x4c) =
                                   *(float *)(local_1348.hit + 0x1c);
                              pRVar40 = (RTCRayQueryContext *)
                                        (ulong)(uint)*(float *)(local_1348.hit + 0x20);
                              *(float *)((long)local_1348.ray + 0x50) =
                                   *(float *)(local_1348.hit + 0x20);
                              paVar37 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.ray;
                            }
                            else {
LAB_00e0fa2b:
                              (ray->super_RayK<1>).tfar = (float)local_1368;
                              paVar37 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.valid;
                            }
                            *(undefined4 *)(local_1358 + lVar36 * 4) = 0;
                            fVar147 = (ray->super_RayK<1>).tfar;
                            auVar92._0_4_ = -(uint)(local_1238[0] <= fVar147) & local_1358._0_4_;
                            auVar92._4_4_ = -(uint)(local_1238[1] <= fVar147) & local_1358._4_4_;
                            auVar92._8_4_ = -(uint)(local_1238[2] <= fVar147) & uStack_1350;
                            auVar92._12_4_ = -(uint)(local_1238[3] <= fVar147) & uStack_134c;
                            _local_1358 = auVar92;
                            iVar42 = movmskps((int)paVar37,auVar92);
                            if (iVar42 != 0) {
                              auVar116._0_4_ = (uint)local_1238[0] & auVar92._0_4_;
                              auVar116._4_4_ = (uint)local_1238[1] & auVar92._4_4_;
                              auVar116._8_4_ = (uint)local_1238[2] & auVar92._8_4_;
                              auVar116._12_4_ = (uint)local_1238[3] & auVar92._12_4_;
                              auVar130._0_8_ =
                                   CONCAT44(~auVar92._4_4_,~auVar92._0_4_) & 0x7f8000007f800000;
                              auVar130._8_4_ = ~auVar92._8_4_ & 0x7f800000;
                              auVar130._12_4_ = ~auVar92._12_4_ & 0x7f800000;
                              auVar130 = auVar130 | auVar116;
                              auVar146._4_4_ = auVar130._0_4_;
                              auVar146._0_4_ = auVar130._4_4_;
                              auVar146._8_4_ = auVar130._12_4_;
                              auVar146._12_4_ = auVar130._8_4_;
                              auVar104 = minps(auVar146,auVar130);
                              auVar117._0_8_ = auVar104._8_8_;
                              auVar117._8_4_ = auVar104._0_4_;
                              auVar117._12_4_ = auVar104._4_4_;
                              auVar104 = minps(auVar117,auVar104);
                              auVar118._0_8_ =
                                   CONCAT44(-(uint)(auVar104._4_4_ == auVar130._4_4_) &
                                            auVar92._4_4_,
                                            -(uint)(auVar104._0_4_ == auVar130._0_4_) &
                                            auVar92._0_4_);
                              auVar118._8_4_ =
                                   -(uint)(auVar104._8_4_ == auVar130._8_4_) & auVar92._8_4_;
                              auVar118._12_4_ =
                                   -(uint)(auVar104._12_4_ == auVar130._12_4_) & auVar92._12_4_;
                              iVar39 = movmskps((int)pRVar40,auVar118);
                              if (iVar39 != 0) {
                                auVar92._8_4_ = auVar118._8_4_;
                                auVar92._0_8_ = auVar118._0_8_;
                                auVar92._12_4_ = auVar118._12_4_;
                              }
                              uVar35 = movmskps(iVar39,auVar92);
                              pRVar40 = (RTCRayQueryContext *)
                                        CONCAT44((int)((ulong)pRVar40 >> 0x20),uVar35);
                              lVar36 = 0;
                              if (pRVar40 != (RTCRayQueryContext *)0x0) {
                                for (; ((ulong)pRVar40 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                                }
                              }
                            }
                            uVar46 = local_10b8;
                          } while ((char)iVar42 != '\0');
                        }
                      }
                    }
                  }
                }
                local_10a0 = local_10a0 & local_10a0 - 1;
              } while (local_10a0 != 0);
            }
            local_10c8 = local_10c8 + 1;
            fVar161 = local_fe8;
            fVar147 = fStack_fe4;
            fVar190 = fStack_fe0;
            fVar196 = fStack_fdc;
          } while (local_10c8 != local_1100);
        }
        local_11e8._4_4_ = (ray->super_RayK<1>).tfar;
        local_11e8._0_4_ = local_11e8._4_4_;
        fStack_11e0 = (float)local_11e8._4_4_;
        fStack_11dc = (float)local_11e8._4_4_;
        auVar104 = _local_1098;
        auVar127 = local_1088;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }